

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pgraph_class_sifm.cc
# Opt level: O2

bool __thiscall
hwtest::pgraph::anon_unknown_5::MthdDvdSrcFormat::is_valid_val(MthdDvdSrcFormat *this)

{
  uint uVar1;
  
  uVar1 = (this->super_SingleMthdTest).super_MthdTest.val;
  if (((0xffff < uVar1) && (uVar1 >> 0x10 <= 3 - (this->which == 0))) &&
     (((uVar1 & 0xe000) == 0 ||
      ((this->which != 1 && ((this->super_SingleMthdTest).super_MthdTest.cls != 0x38)))))) {
    return true;
  }
  return false;
}

Assistant:

bool is_valid_val() override {
		int sfmt = extr(val, 16, 16);
		if (sfmt == 0 || sfmt > (which ? 3 : 2))
			return false;
		if (val & 0xe000 && (cls == 0x38 || which == 1))
			return false;
		return true;
	}